

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

Status __thiscall leveldb::DBImpl::Write(DBImpl *this,WriteOptions *options,WriteBatch *updates)

{
  pthread_mutex_t *__mutex;
  long lVar1;
  WritableFile *pWVar2;
  Writer *this_00;
  int iVar3;
  MemTable *memtable;
  long in_RCX;
  Writer *pWVar4;
  long in_FS_OFFSET;
  bool bVar5;
  Writer *last_writer;
  Writer w;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  Writer local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __mutex = (pthread_mutex_t *)(options + 200);
  Writer::Writer(&local_88,(Mutex *)&__mutex->__data);
  local_88.sync = *(bool *)&(updates->rep_)._M_dataplus._M_p;
  local_88.done = false;
  std::mutex::lock((mutex *)&__mutex->__data);
  local_a8._0_8_ = &local_88;
  std::deque<leveldb::DBImpl::Writer*,std::allocator<leveldb::DBImpl::Writer*>>::
  emplace_back<leveldb::DBImpl::Writer*>
            ((deque<leveldb::DBImpl::Writer*,std::allocator<leveldb::DBImpl::Writer*>> *)
             (options + 0x168),(Writer **)local_a8);
  while( true ) {
    if (local_88.done != false) goto LAB_005316c9;
    if (&local_88 == (Writer *)**(undefined8 **)(options + 0x178)) break;
    port::CondVar::Wait(&local_88.cv);
  }
  MakeRoomForWrite(this,SUB81(options,0));
  lVar1 = *(long *)(*(long *)(options + 0x228) + 0x58);
  pWVar4 = &local_88;
  local_98._8_8_ = &local_88;
  if ((in_RCX != 0) && ((this->super_DB)._vptr_DB == (_func_int **)0x0)) {
    memtable = (MemTable *)BuildBatchGroup((DBImpl *)options,(Writer **)(local_98 + 8));
    WriteBatchInternal::SetSequence((WriteBatch *)memtable,lVar1 + 1);
    iVar3 = WriteBatchInternal::Count((WriteBatch *)memtable);
    pthread_mutex_unlock(__mutex);
    local_a8._0_8_ = (memtable->comparator_).comparator.super_Comparator._vptr_Comparator;
    local_a8._8_8_ = (memtable->comparator_).comparator.user_comparator_;
    log::Writer::AddRecord((Writer *)local_98,*(Slice **)(options + 0x158));
    pWVar2 = (WritableFile *)(this->super_DB)._vptr_DB;
    (this->super_DB)._vptr_DB = (_func_int **)local_98._0_8_;
    local_98._0_8_ = pWVar2;
    Status::~Status((Status *)local_98);
    if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
      if (*(char *)&(updates->rep_)._M_dataplus._M_p == '\x01') {
        (**(code **)(**(long **)(options + 0x148) + 0x28))(local_a8);
        pWVar4 = (Writer *)(this->super_DB)._vptr_DB;
        (this->super_DB)._vptr_DB = (_func_int **)local_a8._0_8_;
        local_a8._0_8_ = pWVar4;
        Status::~Status((Status *)local_a8);
        bVar5 = (this->super_DB)._vptr_DB != (_func_int **)0x0;
        if (bVar5) goto LAB_00531802;
      }
      else {
        bVar5 = false;
      }
      WriteBatchInternal::InsertInto((WriteBatch *)local_a8,memtable);
      pWVar4 = (Writer *)(this->super_DB)._vptr_DB;
      (this->super_DB)._vptr_DB = (_func_int **)local_a8._0_8_;
      local_a8._0_8_ = pWVar4;
      Status::~Status((Status *)local_a8);
    }
    else {
      bVar5 = false;
    }
LAB_00531802:
    std::mutex::lock((mutex *)&__mutex->__data);
    if (bVar5) {
      RecordBackgroundError((DBImpl *)options,(Status *)this);
    }
    if (memtable == *(MemTable **)(options + 0x1b8)) {
      WriteBatch::Clear((WriteBatch *)*(MemTable **)(options + 0x1b8));
    }
    VersionSet::SetLastSequence(*(VersionSet **)(options + 0x228),lVar1 + iVar3);
    pWVar4 = (Writer *)local_98._8_8_;
  }
  do {
    this_00 = (Writer *)**(undefined8 **)(options + 0x178);
    std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::pop_front
              ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_> *)
               (options + 0x168));
    if (this_00 != &local_88) {
      Status::operator=((Status *)this_00,(Status *)this);
      this_00->done = true;
      std::condition_variable::notify_one();
    }
  } while (this_00 != pWVar4);
  if (*(long *)(options + 0x198) != *(long *)(options + 0x178)) {
    std::condition_variable::notify_one();
  }
LAB_0053189a:
  pthread_mutex_unlock(__mutex);
  Writer::~Writer(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (Status)(char *)this;
LAB_005316c9:
  Status::Status((Status *)this,&local_88.status);
  goto LAB_0053189a;
}

Assistant:

Status DBImpl::Write(const WriteOptions& options, WriteBatch* updates) {
  Writer w(&mutex_);
  w.batch = updates;
  w.sync = options.sync;
  w.done = false;

  MutexLock l(&mutex_);
  writers_.push_back(&w);
  while (!w.done && &w != writers_.front()) {
    w.cv.Wait();
  }
  if (w.done) {
    return w.status;
  }

  // May temporarily unlock and wait.
  Status status = MakeRoomForWrite(updates == nullptr);
  uint64_t last_sequence = versions_->LastSequence();
  Writer* last_writer = &w;
  if (status.ok() && updates != nullptr) {  // nullptr batch is for compactions
    WriteBatch* write_batch = BuildBatchGroup(&last_writer);
    WriteBatchInternal::SetSequence(write_batch, last_sequence + 1);
    last_sequence += WriteBatchInternal::Count(write_batch);

    // Add to log and apply to memtable.  We can release the lock
    // during this phase since &w is currently responsible for logging
    // and protects against concurrent loggers and concurrent writes
    // into mem_.
    {
      mutex_.Unlock();
      status = log_->AddRecord(WriteBatchInternal::Contents(write_batch));
      bool sync_error = false;
      if (status.ok() && options.sync) {
        status = logfile_->Sync();
        if (!status.ok()) {
          sync_error = true;
        }
      }
      if (status.ok()) {
        status = WriteBatchInternal::InsertInto(write_batch, mem_);
      }
      mutex_.Lock();
      if (sync_error) {
        // The state of the log file is indeterminate: the log record we
        // just added may or may not show up when the DB is re-opened.
        // So we force the DB into a mode where all future writes fail.
        RecordBackgroundError(status);
      }
    }
    if (write_batch == tmp_batch_) tmp_batch_->Clear();

    versions_->SetLastSequence(last_sequence);
  }

  while (true) {
    Writer* ready = writers_.front();
    writers_.pop_front();
    if (ready != &w) {
      ready->status = status;
      ready->done = true;
      ready->cv.Signal();
    }
    if (ready == last_writer) break;
  }

  // Notify new head of write queue
  if (!writers_.empty()) {
    writers_.front()->cv.Signal();
  }

  return status;
}